

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O0

void av1_rd_cost_update(int mult,RD_STATS *rd_cost)

{
  int64_t iVar1;
  RD_STATS *in_RSI;
  int in_EDI;
  
  if (((in_RSI->rate < 0x7fffffff) && (in_RSI->dist < 0x7fffffffffffffff)) &&
     (in_RSI->rdcost < 0x7fffffffffffffff)) {
    iVar1 = av1_calculate_rd_cost(in_EDI,in_RSI->rate,in_RSI->dist);
    in_RSI->rdcost = iVar1;
  }
  else {
    av1_invalid_rd_stats(in_RSI);
  }
  return;
}

Assistant:

static inline void av1_rd_cost_update(int mult, RD_STATS *rd_cost) {
  if (rd_cost->rate < INT_MAX && rd_cost->dist < INT64_MAX &&
      rd_cost->rdcost < INT64_MAX) {
    rd_cost->rdcost = av1_calculate_rd_cost(mult, rd_cost->rate, rd_cost->dist);
  } else {
    av1_invalid_rd_stats(rd_cost);
  }
}